

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void funcargs(LexState *ls,expdesc *f)

{
  int where;
  int iVar1;
  int i;
  int local_40;
  int line;
  int nparams;
  int base;
  expdesc args;
  FuncState *fs;
  expdesc *f_local;
  LexState *ls_local;
  
  args._16_8_ = ls->fs;
  where = ls->linenumber;
  iVar1 = (ls->t).token;
  if (iVar1 == 0x28) {
    if (where != ls->lastline) {
      luaX_syntaxerror(ls,"ambiguous syntax (function call x new statement)");
    }
    luaX_next(ls);
    if ((ls->t).token == 0x29) {
      nparams = 0;
    }
    else {
      explist1(ls,(expdesc *)&nparams);
      luaK_setreturns((FuncState *)args._16_8_,(expdesc *)&nparams,-1);
    }
    check_match(ls,0x29,0x28,where);
  }
  else if (iVar1 == 0x7b) {
    constructor(ls,(expdesc *)&nparams);
  }
  else {
    if (iVar1 != 0x11e) {
      luaX_syntaxerror(ls,"function arguments expected");
      return;
    }
    codestring(ls,(expdesc *)&nparams,(ls->t).seminfo.ts);
    luaX_next(ls);
  }
  iVar1 = (f->u).s.info;
  if ((nparams == 0xd) || (nparams == 0xe)) {
    local_40 = -1;
  }
  else {
    if (nparams != 0) {
      luaK_exp2nextreg((FuncState *)args._16_8_,(expdesc *)&nparams);
    }
    local_40 = *(int *)(args._16_8_ + 0x3c) - (iVar1 + 1);
  }
  i = luaK_codeABC((FuncState *)args._16_8_,OP_CALL,iVar1,local_40 + 1,2);
  init_exp(f,VCALL,i);
  luaK_fixline((FuncState *)args._16_8_,where);
  *(int *)(args._16_8_ + 0x3c) = iVar1 + 1;
  return;
}

Assistant:

static void funcargs(LexState*ls,expdesc*f){
FuncState*fs=ls->fs;
expdesc args;
int base,nparams;
int line=ls->linenumber;
switch(ls->t.token){
case'(':{
if(line!=ls->lastline)
luaX_syntaxerror(ls,"ambiguous syntax (function call x new statement)");
luaX_next(ls);
if(ls->t.token==')')
args.k=VVOID;
else{
explist1(ls,&args);
luaK_setmultret(fs,&args);
}
check_match(ls,')','(',line);
break;
}
case'{':{
constructor(ls,&args);
break;
}
case TK_STRING:{
codestring(ls,&args,ls->t.seminfo.ts);
luaX_next(ls);
break;
}
default:{
luaX_syntaxerror(ls,"function arguments expected");
return;
}
}
base=f->u.s.info;
if(hasmultret(args.k))
nparams=(-1);
else{
if(args.k!=VVOID)
luaK_exp2nextreg(fs,&args);
nparams=fs->freereg-(base+1);
}
init_exp(f,VCALL,luaK_codeABC(fs,OP_CALL,base,nparams+1,2));
luaK_fixline(fs,line);
fs->freereg=base+1;
}